

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltForCharException.cpp
# Opt level: O0

void __thiscall
antlr::NoViableAltForCharException::NoViableAltForCharException
          (NoViableAltForCharException *this,int c,CharScanner *scanner)

{
  undefined8 uVar1;
  long *in_RDX;
  undefined4 in_ESI;
  string *in_RDI;
  string *s;
  RecognitionException *in_stack_ffffffffffffffb0;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  s = (string *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  uVar1 = (**(code **)(*in_RDX + 0xd0))();
  (**(code **)(*in_RDX + 0xb0))();
  (**(code **)(*in_RDX + 0xc0))();
  RecognitionException::RecognitionException
            (in_stack_ffffffffffffffb0,s,in_RDI,(int)((ulong)uVar1 >> 0x20),(int)uVar1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  *(undefined ***)in_RDI = &PTR__NoViableAltForCharException_00506c08;
  *(undefined4 *)&in_RDI[2].field_2 = in_ESI;
  return;
}

Assistant:

NoViableAltForCharException::NoViableAltForCharException(int c, CharScanner* scanner)
  : RecognitionException("NoViableAlt",
                         scanner->getFilename(),
								 scanner->getLine(),scanner->getColumn()),
    foundChar(c)
{
}